

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::BitState<unsigned_int>,unsigned_int,duckdb::BitXorOperation>
               (uint *idata,AggregateInputData *aggr_input_data,BitState<unsigned_int> *state,
               idx_t count,ValidityMask *mask,SelectionVector *sel_vector)

{
  sel_t *psVar1;
  bool bVar2;
  idx_t i_1;
  uint uVar3;
  idx_t iVar4;
  idx_t i;
  idx_t iVar5;
  
  psVar1 = sel_vector->sel_vector;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      iVar4 = iVar5;
      if (psVar1 != (sel_t *)0x0) {
        iVar4 = (idx_t)psVar1[iVar5];
      }
      uVar3 = idata[iVar4];
      if (state->is_set == false) {
        state->is_set = true;
      }
      else {
        uVar3 = uVar3 ^ state->value;
      }
      state->value = uVar3;
    }
  }
  else {
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      iVar4 = iVar5;
      if (psVar1 != (sel_t *)0x0) {
        iVar4 = (idx_t)psVar1[iVar5];
      }
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&mask->super_TemplatedValidityMask<unsigned_long>,iVar4);
      if (bVar2) {
        if (state->is_set == false) {
          state->value = idata[iVar4];
          state->is_set = true;
        }
        else {
          state->value = state->value ^ idata[iVar4];
        }
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}